

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
helics::CommonCore::createBasicHandle
          (CommonCore *this,GlobalFederateId global_federateId,LocalFederateId param_2,
          InterfaceType HandleType,string_view key,string_view type,string_view units,uint16_t flags
          )

{
  shared_mutex *__rwlock;
  int iVar1;
  BasicHandleInfo *pBVar2;
  
  __rwlock = &(this->handles).m_mutex;
  iVar1 = pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
  if (iVar1 != 0x23) {
    pBVar2 = HandleManager::addHandle
                       (&(this->handles).m_obj,global_federateId,HandleType,key,type,units);
    (pBVar2->local_fed_id).fid = param_2.fid;
    pBVar2->flags = flags;
    pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
    return (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)pBVar2;
  }
  std::__throw_system_error(0x23);
}

Assistant:

const BasicHandleInfo& CommonCore::createBasicHandle(GlobalFederateId global_federateId,
                                                     LocalFederateId local_federateId,
                                                     InterfaceType HandleType,
                                                     std::string_view key,
                                                     std::string_view type,
                                                     std::string_view units,
                                                     uint16_t flags)
{
    return handles.modify([&](auto& hand) -> const BasicHandleInfo& {
        auto& hndl = hand.addHandle(global_federateId, HandleType, key, type, units);
        hndl.local_fed_id = local_federateId;
        hndl.flags = flags;
        return hndl;
    });
}